

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

CLOSE_HANDLE close_create(void)

{
  AMQP_VALUE pAVar1;
  CLOSE_HANDLE local_10;
  CLOSE_INSTANCE *close_instance;
  
  local_10 = (CLOSE_HANDLE)malloc(8);
  if (local_10 != (CLOSE_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x18);
    local_10->composite_value = pAVar1;
    if (local_10->composite_value == (AMQP_VALUE)0x0) {
      free(local_10);
      local_10 = (CLOSE_HANDLE)0x0;
    }
  }
  return local_10;
}

Assistant:

CLOSE_HANDLE close_create(void)
{
    CLOSE_INSTANCE* close_instance = (CLOSE_INSTANCE*)malloc(sizeof(CLOSE_INSTANCE));
    if (close_instance != NULL)
    {
        close_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(24);
        if (close_instance->composite_value == NULL)
        {
            free(close_instance);
            close_instance = NULL;
        }
    }

    return close_instance;
}